

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

index_t __thiscall filtered_union_find::find(filtered_union_find *this,index_t x)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  index_t y;
  bool bVar5;
  
  piVar1 = (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar1[x];
  iVar2 = iVar3;
  if (iVar3 != x) {
    do {
      iVar3 = piVar1[iVar2];
      bVar5 = iVar3 != iVar2;
      iVar2 = iVar3;
    } while (bVar5);
  }
  iVar2 = piVar1[x];
  while (iVar4 = iVar2, iVar3 != iVar4) {
    piVar1[x] = iVar3;
    x = iVar4;
    iVar2 = piVar1[iVar4];
  }
  return iVar3;
}

Assistant:

index_t find(index_t x) {
		index_t y = x, z = parent[y];
		while (z != y) {
			y = z;
			z = parent[y];
		}
		y = parent[x];
		while (z != y) {
			parent[x] = z;
			x = y;
			y = parent[x];
		}
		return z;
	}